

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

OpenCLDebugInfo100Instructions __thiscall
spvtools::opt::Instruction::GetOpenCL100DebugOpcode(Instruction *this)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  FeatureManager *pFVar5;
  Instruction *this_local;
  
  OVar1 = opcode(this);
  if (OVar1 == OpExtInst) {
    pIVar4 = context(this);
    pFVar5 = IRContext::get_feature_mgr(pIVar4);
    uVar2 = FeatureManager::GetExtInstImportId_OpenCL100DebugInfo(pFVar5);
    if (uVar2 == 0) {
      this_local._4_4_ = OpenCLDebugInfo100InstructionsMax;
    }
    else {
      uVar2 = GetSingleWordInOperand(this,0);
      pIVar4 = context(this);
      pFVar5 = IRContext::get_feature_mgr(pIVar4);
      uVar3 = FeatureManager::GetExtInstImportId_OpenCL100DebugInfo(pFVar5);
      if (uVar2 == uVar3) {
        this_local._4_4_ = GetSingleWordInOperand(this,1);
      }
      else {
        this_local._4_4_ = OpenCLDebugInfo100InstructionsMax;
      }
    }
  }
  else {
    this_local._4_4_ = OpenCLDebugInfo100InstructionsMax;
  }
  return this_local._4_4_;
}

Assistant:

OpenCLDebugInfo100Instructions Instruction::GetOpenCL100DebugOpcode() const {
  if (opcode() != spv::Op::OpExtInst) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  if (!context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  if (GetSingleWordInOperand(kExtInstSetIdInIdx) !=
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  return OpenCLDebugInfo100Instructions(
      GetSingleWordInOperand(kExtInstInstructionInIdx));
}